

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::setup_transposeLP(HModel *this)

{
  int iVar1;
  reference pvVar2;
  value_type vVar3;
  double dVar4;
  size_type sVar5;
  vector<double,_std::allocator<double>_> *this_00;
  reference pvVar6;
  long in_RDI;
  int iPut;
  int iRow;
  int k_1;
  int iCol;
  int i_2;
  int i_1;
  int k;
  vector<double,_std::allocator<double>_> ARvalue;
  vector<int,_std::allocator<int>_> ARindex;
  int AcountX;
  vector<int,_std::allocator<int>_> ARstart;
  vector<int,_std::allocator<int>_> iwork;
  double upper_1;
  double lower_1;
  int i;
  vector<double,_std::allocator<double>_> dualCost;
  vector<double,_std::allocator<double>_> dualColUpper;
  vector<double,_std::allocator<double>_> dualColLower;
  double upper;
  double lower;
  int j;
  vector<double,_std::allocator<double>_> dualRowUpper;
  vector<double,_std::allocator<double>_> dualRowLower;
  double inf;
  int transposeCancelled;
  int in_stack_fffffffffffffd7c;
  undefined4 in_stack_fffffffffffffd80;
  int in_stack_fffffffffffffd84;
  allocator_type *in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd90;
  value_type in_stack_fffffffffffffd94;
  undefined4 in_stack_fffffffffffffd98;
  value_type vVar7;
  undefined4 in_stack_fffffffffffffd9c;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffda0;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  int local_178;
  vector<double,_std::allocator<double>_> local_170;
  vector<int,_std::allocator<int>_> local_150;
  int local_134;
  undefined4 local_12c;
  vector<int,_std::allocator<int>_> local_128;
  undefined4 local_10c;
  vector<int,_std::allocator<int>_> local_108;
  double local_f0;
  double local_e8;
  int local_e0;
  vector<double,_std::allocator<double>_> local_d8;
  vector<double,_std::allocator<double>_> local_b8;
  vector<double,_std::allocator<double>_> local_98;
  undefined4 local_7c;
  double local_78;
  double local_70;
  int local_68;
  vector<double,_std::allocator<double>_> local_60 [2];
  vector<double,_std::allocator<double>_> local_30;
  undefined8 local_18;
  int local_c;
  
  if ((*(int *)(in_RDI + 4) != 0) &&
     (local_c = 0,
     ((double)*(int *)(in_RDI + 0x60c) * 1.0) / (double)*(int *)(in_RDI + 0x610) <= 0.2)) {
    local_18 = 0x6974e718d7d7625a;
    std::allocator<double>::allocator((allocator<double> *)0x179c49);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffda0,
               CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
               (allocator_type *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    std::allocator<double>::~allocator((allocator<double> *)0x179c75);
    std::allocator<double>::allocator((allocator<double> *)0x179ca1);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffda0,
               CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
               (allocator_type *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    std::allocator<double>::~allocator((allocator<double> *)0x179ccd);
    for (local_68 = 0; local_68 < *(int *)(in_RDI + 0x60c); local_68 = local_68 + 1) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6a8),(long)local_68
                         );
      local_70 = *pvVar2;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6c0),(long)local_68
                         );
      local_78 = *pvVar2;
      if ((((local_70 != -1e+200) || (NAN(local_70))) || (local_78 != 1e+200)) || (NAN(local_78))) {
        if (((local_70 != 0.0) || (NAN(local_70))) || ((local_78 != 1e+200 || (NAN(local_78))))) {
          if (((local_70 != -1e+200) || (NAN(local_70))) || ((local_78 != 0.0 || (NAN(local_78)))))
          {
            if ((((local_70 != 0.0) || (NAN(local_70))) || (local_78 != 0.0)) || (NAN(local_78))) {
              local_c = 1;
              break;
            }
            pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&local_30,(long)local_68);
            *pvVar2 = -1e+200;
            pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                               (local_60,(long)local_68);
            *pvVar2 = 1e+200;
          }
          else {
            pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x690),
                                (long)local_68);
            vVar3 = *pvVar2;
            pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&local_30,(long)local_68);
            *pvVar2 = vVar3;
            pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                               (local_60,(long)local_68);
            *pvVar2 = 1e+200;
          }
        }
        else {
          pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_30,(long)local_68);
          *pvVar2 = -1e+200;
          pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x690),
                              (long)local_68);
          vVar3 = *pvVar2;
          pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](local_60,(long)local_68)
          ;
          *pvVar2 = vVar3;
        }
      }
      else {
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x690),
                            (long)local_68);
        vVar3 = *pvVar2;
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,(long)local_68);
        *pvVar2 = vVar3;
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x690),
                            (long)local_68);
        vVar3 = *pvVar2;
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](local_60,(long)local_68);
        *pvVar2 = vVar3;
      }
    }
    if (local_c == 1) {
      local_7c = 1;
    }
    else {
      std::allocator<double>::allocator((allocator<double> *)0x17a094);
      std::vector<double,_std::allocator<double>_>::vector
                (in_stack_fffffffffffffda0,
                 CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                 (allocator_type *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
      std::allocator<double>::~allocator((allocator<double> *)0x17a0c0);
      std::allocator<double>::allocator((allocator<double> *)0x17a0ec);
      std::vector<double,_std::allocator<double>_>::vector
                (in_stack_fffffffffffffda0,
                 CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                 (allocator_type *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
      std::allocator<double>::~allocator((allocator<double> *)0x17a118);
      std::allocator<double>::allocator((allocator<double> *)0x17a144);
      std::vector<double,_std::allocator<double>_>::vector
                (in_stack_fffffffffffffda0,
                 CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                 (allocator_type *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
      std::allocator<double>::~allocator((allocator<double> *)0x17a170);
      for (local_e0 = 0; local_e0 < *(int *)(in_RDI + 0x610); local_e0 = local_e0 + 1) {
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6f0),
                            (long)local_e0);
        local_e8 = *pvVar2;
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x708),
                            (long)local_e0);
        local_f0 = *pvVar2;
        if ((local_e8 != local_f0) || (NAN(local_e8) || NAN(local_f0))) {
          if (((local_e8 != -1e+200) || (NAN(local_e8))) ||
             ((local_f0 == 1e+200 && (!NAN(local_f0))))) {
            if (((local_e8 == -1e+200) && (!NAN(local_e8))) ||
               ((local_f0 != 1e+200 || (NAN(local_f0))))) {
              if ((((local_e8 != -1e+200) || (NAN(local_e8))) || (local_f0 != 1e+200)) ||
                 (NAN(local_f0))) {
                local_c = 1;
                break;
              }
              pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (&local_98,(long)local_e0);
              *pvVar2 = 0.0;
              pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (&local_b8,(long)local_e0);
              *pvVar2 = 0.0;
              pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (&local_d8,(long)local_e0);
              *pvVar2 = 0.0;
            }
            else {
              pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (&local_98,(long)local_e0);
              *pvVar2 = 0.0;
              pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (&local_b8,(long)local_e0);
              *pvVar2 = 1e+200;
              vVar3 = -local_e8;
              pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (&local_d8,(long)local_e0);
              *pvVar2 = vVar3;
            }
          }
          else {
            pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&local_98,(long)local_e0);
            *pvVar2 = -1e+200;
            pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&local_b8,(long)local_e0);
            *pvVar2 = 0.0;
            dVar4 = -local_f0;
            pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&local_d8,(long)local_e0);
            *pvVar2 = dVar4;
          }
        }
        else {
          pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_98,(long)local_e0);
          *pvVar2 = -1e+200;
          pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_b8,(long)local_e0);
          *pvVar2 = 1e+200;
          vVar3 = -local_e8;
          pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_d8,(long)local_e0);
          *pvVar2 = vVar3;
        }
      }
      if (local_c == 1) {
        local_7c = 1;
      }
      else {
        local_10c = 0;
        std::allocator<int>::allocator((allocator<int> *)0x17a58e);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffda0,
                   CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                   (value_type *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                   in_stack_fffffffffffffd88);
        std::allocator<int>::~allocator((allocator<int> *)0x17a5bc);
        local_12c = 0;
        std::allocator<int>::allocator((allocator<int> *)0x17a5f0);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffda0,
                   CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                   (value_type *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                   in_stack_fffffffffffffd88);
        std::allocator<int>::~allocator((allocator<int> *)0x17a61e);
        sVar5 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x660));
        local_134 = (int)sVar5;
        std::allocator<int>::allocator((allocator<int> *)0x17a658);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffda0,
                   CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                   (allocator_type *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
        std::allocator<int>::~allocator((allocator<int> *)0x17a67e);
        this_00 = (vector<double,_std::allocator<double>_> *)(long)local_134;
        std::allocator<double>::allocator((allocator<double> *)0x17a69d);
        std::vector<double,_std::allocator<double>_>::vector
                  (this_00,CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                   (allocator_type *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
        std::allocator<double>::~allocator((allocator<double> *)0x17a6c3);
        for (local_178 = 0; local_178 < local_134; local_178 = local_178 + 1) {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x660),(long)local_178)
          ;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_108,(long)*pvVar6);
          *pvVar6 = *pvVar6 + 1;
        }
        for (local_17c = 1; local_17c <= *(int *)(in_RDI + 0x610); local_17c = local_17c + 1) {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&local_128,(long)(local_17c + -1));
          vVar7 = *pvVar6;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&local_108,(long)(local_17c + -1));
          iVar1 = vVar7 + *pvVar6;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_128,(long)local_17c);
          *pvVar6 = iVar1;
        }
        for (local_180 = 0; local_180 < *(int *)(in_RDI + 0x610); local_180 = local_180 + 1) {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_128,(long)local_180);
          in_stack_fffffffffffffd94 = *pvVar6;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_108,(long)local_180);
          *pvVar6 = in_stack_fffffffffffffd94;
        }
        for (local_184 = 0; local_184 < *(int *)(in_RDI + 0x60c); local_184 = local_184 + 1) {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),(long)local_184)
          ;
          local_188 = *pvVar6;
          while (in_stack_fffffffffffffd90 = local_188,
                pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),
                                    (long)(local_184 + 1)), in_stack_fffffffffffffd90 < *pvVar6) {
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x660),
                                (long)local_188);
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_108,(long)*pvVar6);
            iVar1 = *pvVar6;
            *pvVar6 = iVar1 + 1;
            in_stack_fffffffffffffd84 = local_184;
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_150,(long)iVar1);
            *pvVar6 = in_stack_fffffffffffffd84;
            pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x678),
                                (long)local_188);
            in_stack_fffffffffffffd88 = (allocator_type *)*pvVar2;
            pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&local_170,(long)iVar1);
            *pvVar2 = (value_type)in_stack_fffffffffffffd88;
            local_188 = local_188 + 1;
          }
        }
        std::swap<int>((int *)(in_RDI + 0x610),(int *)(in_RDI + 0x60c));
        std::vector<int,_std::allocator<int>_>::swap
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                   (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd88);
        std::vector<int,_std::allocator<int>_>::swap
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                   (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd88);
        std::vector<double,_std::allocator<double>_>::swap
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                   (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd88);
        std::vector<double,_std::allocator<double>_>::swap
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                   (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd88);
        std::vector<double,_std::allocator<double>_>::swap
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                   (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd88);
        std::vector<double,_std::allocator<double>_>::swap
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                   (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd88);
        std::vector<double,_std::allocator<double>_>::swap
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                   (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd88);
        std::vector<double,_std::allocator<double>_>::swap
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                   (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd88);
        mlFg_Update((HModel *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                    in_stack_fffffffffffffd7c);
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
        local_7c = 0;
      }
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  }
  return;
}

Assistant:

void HModel::setup_transposeLP() {
    if (intOption[INTOPT_TRANSPOSE_FLAG] == 0)
        return;

    int transposeCancelled = 0;
    if (1.0 * numCol / numRow > 0.2) {
//        cout << "transpose-cancelled-by-ratio" << endl;
        transposeCancelled = 1;
        return;
    }

    // Convert primal cost to dual bound
    const double inf = HSOL_CONST_INF;
    vector<double> dualRowLower(numCol);
    vector<double> dualRowUpper(numCol);
    for (int j = 0; j < numCol; j++) {
        double lower = colLower[j];
        double upper = colUpper[j];

        /*
         * Primal      Dual
         * Free        row = c
         * x > 0       row < c
         * x < 0       row > c
         * x = 0       row free
         * other       cancel
         */

        if (lower == -inf && upper == inf) {
            dualRowLower[j] = colCost[j];
            dualRowUpper[j] = colCost[j];
        } else if (lower == 0 && upper == inf) {
            dualRowLower[j] = -inf;
            dualRowUpper[j] = colCost[j];
        } else if (lower == -inf && upper == 0) {
            dualRowLower[j] = colCost[j];
            dualRowUpper[j] = +inf;
        } else if (lower == 0 && upper == 0) {
            dualRowLower[j] = -inf;
            dualRowUpper[j] = +inf;
        } else {
            transposeCancelled = 1;
            break;
        }
    }

    // Check flag
    if (transposeCancelled == 1) {
//        cout << "transpose-cancelled-by-column" << endl;
        return;
    }

    // Convert primal row bound to dual variable cost
    vector<double> dualColLower(numRow);
    vector<double> dualColUpper(numRow);
    vector<double> dualCost(numRow);
    for (int i = 0; i < numRow; i++) {
        double lower = rowLower[i];
        double upper = rowUpper[i];

        /*
         * Primal      Dual
         * row = b     Free
         * row < b     y < 0
         * row > b     y > 0
         * row free    y = 0
         * other       cancel
         */

        if (lower == upper) {
            dualColLower[i] = -inf;
            dualColUpper[i] = +inf;
            dualCost[i] = -lower;
        } else if (lower == -inf && upper != inf) {
            dualColLower[i] = -inf;
            dualColUpper[i] = 0;
            dualCost[i] = -upper;
        } else if (lower != -inf && upper == inf) {
            dualColLower[i] = 0;
            dualColUpper[i] = +inf;
            dualCost[i] = -lower;
        } else if (lower == -inf && upper == inf) {
            dualColLower[i] = 0;
            dualColUpper[i] = 0;
            dualCost[i] = 0;
        } else {
            transposeCancelled = 1;
            break;
        }
    }

    // Check flag
    if (transposeCancelled == 1) {
//        cout << "transpose-cancelled-by-row" << endl;
        return;
    }

    // We can now really transpose things
    vector<int> iwork(numRow, 0);
    vector<int> ARstart(numRow + 1, 0);
    int AcountX = Aindex.size();
    vector<int> ARindex(AcountX);
    vector<double> ARvalue(AcountX);
    for (int k = 0; k < AcountX; k++)
        iwork[Aindex[k]]++;
    for (int i = 1; i <= numRow; i++)
        ARstart[i] = ARstart[i - 1] + iwork[i - 1];
    for (int i = 0; i < numRow; i++)
        iwork[i] = ARstart[i];
    for (int iCol = 0; iCol < numCol; iCol++) {
        for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
            int iRow = Aindex[k];
            int iPut = iwork[iRow]++;
            ARindex[iPut] = iCol;
            ARvalue[iPut] = Avalue[k];
        }
    }

    // Transpose the problem!
    swap(numRow, numCol);
    Astart.swap(ARstart);
    Aindex.swap(ARindex);
    Avalue.swap(ARvalue);
    colLower.swap(dualColLower);
    colUpper.swap(dualColUpper);
    rowLower.swap(dualRowLower);
    rowUpper.swap(dualRowUpper);
    colCost.swap(dualCost);
//    cout << "problem-transposed" << endl;
    //Deduce the consequences of transposing the LP
    mlFg_Update(mlFg_action_TransposeLP);
}